

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

DeviceContextIndex __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::GetExecutionCtxId
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Char *Message;
  undefined1 local_38 [8];
  string msg;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = IsDeferred(this);
  if ((bVar1) && (bVar1 = IsRecordingDeferredCommands(this), !bVar1)) {
    FormatString<char[110]>
              ((string *)local_38,
               (char (*) [110])
               "For deferred contexts, the execution context id may only be requested while the context is in recording state"
              );
    Message = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (Message,"GetExecutionCtxId",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x15c);
    std::__cxx11::string::~string((string *)local_38);
  }
  bVar1 = IsDeferred(this);
  if (bVar1) {
    this_local._7_1_ = (this->m_DstImmediateContextId).m_Value;
  }
  else {
    this_local._7_1_ = GetContextId(this);
  }
  return (DeviceContextIndex)this_local._7_1_;
}

Assistant:

DeviceContextIndex GetExecutionCtxId() const
    {
        VERIFY(!IsDeferred() || IsRecordingDeferredCommands(),
               "For deferred contexts, the execution context id may only be requested while the context is in recording state");
        return IsDeferred() ? m_DstImmediateContextId : GetContextId();
    }